

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_geometry_device.cpp
# Opt level: O1

void embree::displacementFunction(RTCDisplacementFunctionNArguments *args)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  uVar7 = args->N;
  if ((ulong)uVar7 != 0) {
    pfVar8 = args->Ng_x;
    pfVar9 = args->Ng_y;
    pfVar10 = args->Ng_z;
    pfVar11 = args->P_x;
    pfVar12 = args->P_y;
    pfVar13 = args->P_z;
    uVar14 = 0;
    do {
      fVar1 = pfVar12[uVar14];
      fVar2 = pfVar11[uVar14];
      fVar3 = pfVar13[uVar14];
      fVar4 = pfVar10[uVar14];
      fVar5 = pfVar9[uVar14];
      fVar6 = pfVar8[uVar14];
      fVar17 = 0.0;
      fVar15 = 1.0;
      do {
        local_48.m128[0] = fVar15 * fVar2;
        local_48.m128[1] = fVar15 * fVar1;
        local_48.m128[2] = fVar15 * fVar3;
        local_48.m128[3] = fVar15 * 0.0;
        fVar16 = noise((Vec3fa *)&local_48.field_1);
        fVar17 = fVar17 + (ABS(fVar16) * 1.4 * ABS(fVar16)) / fVar15;
        fVar15 = fVar15 + fVar15;
      } while (fVar15 < 40.0);
      pfVar11[uVar14] = pfVar11[uVar14] + fVar17 * fVar6;
      pfVar12[uVar14] = fVar17 * fVar5 + pfVar12[uVar14];
      pfVar13[uVar14] = fVar17 * fVar4 + pfVar13[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar7);
  }
  return;
}

Assistant:

void displacementFunction(const struct RTCDisplacementFunctionNArguments* args)
{
  const float* nx = args->Ng_x;
  const float* ny = args->Ng_y;
  const float* nz = args->Ng_z;
  float* px = args->P_x;
  float* py = args->P_y;
  float* pz = args->P_z;
  unsigned int N = args->N;
                                   
  for (unsigned int i=0; i<N; i++) {
    const Vec3fa P = Vec3fa(px[i],py[i],pz[i]);
    const Vec3fa Ng = Vec3fa(nx[i],ny[i],nz[i]);
    const Vec3fa dP = displacement(P)*Ng;
    px[i] += dP.x; py[i] += dP.y; pz[i] += dP.z;
  }
}